

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::isbadport::isbadport(isbadport *this)

{
  long lVar1;
  long in_FS_OFFSET;
  TestOpts *in_stack_00000130;
  ChainType in_stack_0000013c;
  BasicTestingSetup *in_stack_00000140;
  TestOpts *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&in_stack_ffffffffffffffa8->extra_args);
  BasicTestingSetup::BasicTestingSetup(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  TestOpts::~TestOpts(in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(isbadport)
{
    BOOST_CHECK(IsBadPort(1));
    BOOST_CHECK(IsBadPort(22));
    BOOST_CHECK(IsBadPort(6000));

    BOOST_CHECK(!IsBadPort(80));
    BOOST_CHECK(!IsBadPort(443));
    BOOST_CHECK(!IsBadPort(8333));

    // Check all ports, there must be 80 bad ports in total.
    size_t total_bad_ports{0};
    for (uint16_t port = std::numeric_limits<uint16_t>::max(); port > 0; --port) {
        if (IsBadPort(port)) {
            ++total_bad_ports;
        }
    }
    BOOST_CHECK_EQUAL(total_bad_ports, 80);
}